

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O2

void __thiscall
CTestGen9Resource_TestCubeTileYsResource_Test::TestBody
          (CTestGen9Resource_TestCubeTileYsResource_Test *this)

{
  GMM_RESOURCE_FORMAT GVar1;
  uint32_t uVar2;
  GMM_RESOURCE_INFO *ResourceInfo;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  uint32_t uVar6;
  long lVar7;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  ulong local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  GMM_REQ_OFFSET_INFO OffsetInfo;
  AssertHelper local_68;
  GMM_RESOURCE_INFO *local_60;
  uint32_t local_54;
  ulong local_50;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  internal local_40 [8];
  AssertionResult gtest_ar;
  
  local_108 = 0;
  uStack_150 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_168 = 4;
  uStack_100 = 0x100000000;
  local_158 = 0x5000000000;
  uStack_160 = 0x400000000;
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    GVar1 = CTestResource::SetResourceFormat((CTestResource *)this,(TEST_BPP)lVar7);
    local_168 = CONCAT44(GVar1,(undefined4)local_168);
    local_138 = 1;
    uStack_130 = 0x100000001;
    ResourceInfo = (GMM_RESOURCE_INFO *)
                   (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                             (CommonULT::pGmmULTClientContext,&local_168);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,ResourceInfo,(&DAT_0018e2d0)[lVar7]);
    local_50 = (ulong)(uint)(&DAT_0018e2f0)[lVar7];
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,ResourceInfo,(&DAT_0018e2f0)[lVar7]);
    uVar2 = (&DAT_0018e310)[lVar7 * 2];
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,ResourceInfo,uVar2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,ResourceInfo,1);
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,ResourceInfo,local_50);
    iVar5 = uVar2 * (int)local_50;
    local_60 = ResourceInfo;
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this,ResourceInfo,(ulong)(uint)(iVar5 * 6));
    local_50 = local_50 & 0xffffffff00000000;
    uVar3 = 0;
    while (uVar3 != 6) {
      OffsetInfo._0_4_ = 0;
      OffsetInfo.ArrayIndex = 0;
      OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
      OffsetInfo.Plane = GMM_NO_PLANE;
      OffsetInfo.StdLayout.Offset = 0;
      OffsetInfo.StdLayout.TileRowPitch = 0;
      OffsetInfo.Render.XOffset = 0;
      OffsetInfo.Render.YOffset = 0;
      OffsetInfo.Render.ZOffset = 0;
      OffsetInfo.Render._20_4_ = 0;
      OffsetInfo.Lock.Pitch = 0;
      OffsetInfo.Lock.field_2 =
           (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
      OffsetInfo.Render.field_0.Offset64 = 0;
      OffsetInfo.Frame = GMM_DISPLAY_BASE;
      OffsetInfo._28_4_ = 0;
      OffsetInfo.Lock.field_0.Offset64 = 0;
      uStack_e8 = 1;
      OffsetInfo.Slice = 0;
      OffsetInfo.MipLevel = uVar3;
      local_54 = uVar3;
      (**(code **)(*(long *)local_60 + 0x68))(local_60,&uStack_e8);
      local_48.ptr_._0_4_ = (int)local_50;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_40,"(CubeFaceIndex * ExpectedQPitch) * ExpectedPitch",
                 "OffsetInfo.Render.Offset64",(uint *)&local_48,
                 (unsigned_long *)&OffsetInfo.Lock.Pitch);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar4 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc93,pcVar4);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      local_48.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_40,"0","OffsetInfo.Render.XOffset",(int *)&local_48,
                 (uint *)&OffsetInfo.Render);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar4 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc94,pcVar4);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      local_48.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_40,"0","OffsetInfo.Render.YOffset",(int *)&local_48,
                 (uint *)((long)&OffsetInfo.Render.field_0 + 4));
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar4 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc95,pcVar4);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      local_48.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_40,"0","OffsetInfo.Render.ZOffset",(int *)&local_48,
                 &OffsetInfo.Render.XOffset);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar4 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc96,pcVar4);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      local_50 = CONCAT44(local_50._4_4_,(int)local_50 + iVar5);
      uVar3 = local_54 + 1;
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,local_60);
  }
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    GVar1 = CTestResource::SetResourceFormat((CTestResource *)this,(TEST_BPP)lVar7);
    local_168 = CONCAT44(GVar1,(undefined4)local_168);
    local_50 = (ulong)(uint)(&DAT_0018e310)[lVar7 * 2];
    uVar2 = CTestResource::GetBppValue((CTestResource *)this,(TEST_BPP)lVar7);
    uVar6 = 0;
    uVar3 = (int)((local_50 & 0xffffffff) / (ulong)uVar2) + 1;
    local_138 = (ulong)uVar3;
    uStack_130 = CONCAT44(1,uVar3);
    local_60 = (GMM_RESOURCE_INFO *)
               (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                         (CommonULT::pGmmULTClientContext,&local_168,
                          (local_50 & 0xffffffff) % (ulong)uVar2);
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,local_60,(&DAT_0018e2d0)[lVar7])
    ;
    uVar2 = (&DAT_0018e2f0)[lVar7];
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,local_60,uVar2);
    local_54 = (int)local_50 * 2;
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,local_60,local_54);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,local_60,2);
    uVar3 = -uVar2 & (uVar2 - 1) + (int)uStack_130;
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,local_60,(ulong)uVar3);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this,local_60,(ulong)((int)local_50 * uVar3 * 0xc));
    iVar5 = uVar3 * local_54;
    uVar3 = 0;
    while (uVar3 != 6) {
      OffsetInfo._0_4_ = 0;
      OffsetInfo.ArrayIndex = 0;
      OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
      OffsetInfo.Plane = GMM_NO_PLANE;
      OffsetInfo.StdLayout.Offset = 0;
      OffsetInfo.StdLayout.TileRowPitch = 0;
      OffsetInfo.Render.XOffset = 0;
      OffsetInfo.Render.YOffset = 0;
      OffsetInfo.Render.ZOffset = 0;
      OffsetInfo.Render._20_4_ = 0;
      OffsetInfo.Lock.Pitch = 0;
      OffsetInfo.Lock.field_2 =
           (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
      OffsetInfo.Render.field_0.Offset64 = 0;
      OffsetInfo.Frame = GMM_DISPLAY_BASE;
      OffsetInfo._28_4_ = 0;
      OffsetInfo.Lock.field_0.Offset64 = 0;
      uStack_e8 = 1;
      local_50 = CONCAT44(local_50._4_4_,uVar3);
      OffsetInfo.Slice = 0;
      OffsetInfo.MipLevel = uVar3;
      (**(code **)(*(long *)local_60 + 0x68))(local_60,&uStack_e8);
      local_48.ptr_._0_4_ = uVar6;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_40,"(CubeFaceIndex * ExpectedQPitch) * ExpectedPitch",
                 "OffsetInfo.Render.Offset64",(uint *)&local_48,
                 (unsigned_long *)&OffsetInfo.Lock.Pitch);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar4 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xcbe,pcVar4);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      local_54 = uVar6;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      local_48.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_40,"0","OffsetInfo.Render.XOffset",(int *)&local_48,
                 (uint *)&OffsetInfo.Render);
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar4 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xcbf,pcVar4);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      local_48.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_40,"0","OffsetInfo.Render.YOffset",(int *)&local_48,
                 (uint *)((long)&OffsetInfo.Render.field_0 + 4));
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar4 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xcc0,pcVar4);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      local_48.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,unsigned_int>
                (local_40,"0","OffsetInfo.Render.ZOffset",(int *)&local_48,
                 &OffsetInfo.Render.XOffset);
      uVar6 = local_54;
      if (local_40[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar4 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar4 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xcc1,pcVar4);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_48);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      uVar6 = uVar6 + iVar5;
      uVar3 = (int)local_50 + 1;
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,local_60);
  }
  return;
}

Assistant:

TEST_F(CTestGen9Resource, TestCubeTileYsResource)
{
    // Cube is allocated as an array of 6 2D surface representing each cube face below
    //===============================
    // �q� coordinate  |    face    |
    //      0          |    + x     |
    //      1          |    - x     |
    //      2          |    + y     |
    //      3          |    - y     |
    //      4          |    + z     |
    //      5          |    - z     |
    //===============================

    const uint32_t HAlign[TEST_BPP_MAX] = {256, 256, 128, 128, 64};
    const uint32_t VAlign[TEST_BPP_MAX] = {256, 128, 128, 64, 64};

    const uint32_t TileSize[TEST_BPP_MAX][2] = {{256, 256},
                                                {512, 128},
                                                {512, 128},
                                                {1024, 64},
                                                {1024, 64}};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_CUBE;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledY    = 1;
    gmmParams.Flags.Info.TiledYs   = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    // Allocate 1x1 surface so that it occupies 1 Tile in X dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);

        uint32_t ExpectedPitch = TileSize[i][0];
        VerifyResourcePitch<true>(ResourceInfo, ExpectedPitch); // As wide as 1 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 1);      // 1 tile wide

        uint32_t ExpectedQPitch = VAlign[i];
        VerifyResourceQPitch<true>(ResourceInfo, ExpectedQPitch); // Each face should be VAlign rows apart within a tile

        VerifyResourceSize<true>(ResourceInfo, // PitchInBytes * Rows where Rows = __GMM_MAX_CUBE_FACE x QPitch, then aligned to tile boundary
                                 ExpectedPitch *
                                 __GMM_MAX_CUBE_FACE * ExpectedQPitch);

        for(uint32_t CubeFaceIndex = 0; CubeFaceIndex < __GMM_MAX_CUBE_FACE; CubeFaceIndex++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.CubeFace            = static_cast<GMM_CUBE_FACE_ENUM>(CubeFaceIndex);
            ResourceInfo->GetOffset(OffsetInfo);

            EXPECT_EQ((CubeFaceIndex * ExpectedQPitch) * ExpectedPitch,
                      OffsetInfo.Render.Offset64);   // Render offset is tile's base address on which cube face begins.
            EXPECT_EQ(0, OffsetInfo.Render.XOffset); // X Offset should be 0 as cube face starts on tile boundary
            EXPECT_EQ(0, OffsetInfo.Render.YOffset); // Y Offset should be 0 as cube face starts on tile boundary
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset); // Z offset N/A should be 0
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X dimension.
    // Width and Height must be equal
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = gmmParams.BaseWidth64;                   // Heigth must be equal to width.
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);

        uint32_t ExpectedPitch = TileSize[i][0] * 2; // As wide as 2 tile
        VerifyResourcePitch<true>(ResourceInfo, ExpectedPitch);
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2); // 2 tile wide

        uint32_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign[i]);
        VerifyResourceQPitch<true>(ResourceInfo, ExpectedQPitch); // Each face should be Valigned-BaseHeight rows apart

        VerifyResourceSize<true>(ResourceInfo, // PitchInBytes * Rows where Rows = __GMM_MAX_CUBE_FACE x QPitch, then aligned to tile boundary
                                 ExpectedPitch *
                                 __GMM_MAX_CUBE_FACE * ExpectedQPitch);

        for(uint32_t CubeFaceIndex = 0; CubeFaceIndex < __GMM_MAX_CUBE_FACE; CubeFaceIndex++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.CubeFace            = static_cast<GMM_CUBE_FACE_ENUM>(CubeFaceIndex);
            ResourceInfo->GetOffset(OffsetInfo);
            EXPECT_EQ((CubeFaceIndex * ExpectedQPitch) * ExpectedPitch,
                      OffsetInfo.Render.Offset64);   // Render offset is tile's base address on which cube face begins.
            EXPECT_EQ(0, OffsetInfo.Render.XOffset); // X Offset should be 0 as cube face starts on tile boundary
            EXPECT_EQ(0, OffsetInfo.Render.YOffset); // Y Offset should be 0 as cube face starts on tile boundary
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset); // Z offset N/A should be 0
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}